

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

void rpn_StartOfSectionType(Expression *expr,SectionType type)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  uint8_t *puVar4;
  uint8_t *ptr;
  int size;
  Expression *_expr;
  SectionType type_local;
  Expression *expr_local;
  
  rpn_Init(expr);
  expr->isKnown = false;
  pcVar2 = (char *)malloc(0x80);
  expr->reason = pcVar2;
  if (expr->reason == (char *)0x0) {
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    fatalerror("Can\'t allocate err string: %s\n",pcVar2);
  }
  iVar1 = snprintf(expr->reason,0x80,"Section type\'s start is not known");
  if (0x7f < iVar1) {
    pcVar2 = (char *)realloc(expr->reason,(long)(iVar1 + 1));
    expr->reason = pcVar2;
    if (expr->reason == (char *)0x0) {
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      fatalerror("Can\'t allocate err string: %s\n",pcVar2);
    }
    sprintf(expr->reason,"Section type\'s start is not known");
  }
  puVar4 = reserveSpace(expr,2);
  expr->rpnPatchSize = expr->rpnPatchSize + 2;
  *puVar4 = 'V';
  puVar4[1] = (uint8_t)type;
  return;
}

Assistant:

void rpn_StartOfSectionType(struct Expression *expr, enum SectionType type)
{
	rpn_Init(expr);
	makeUnknown(expr, "Section type's start is not known");

	uint8_t *ptr = reserveSpace(expr, 2);

	expr->rpnPatchSize += 2;
	*ptr++ = RPN_STARTOF_SECTTYPE;
	*ptr++ = type;
}